

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O2

jp2_box_t * jp2_box_create(int type)

{
  jp2_box_t *pjVar1;
  jp2_boxinfo_t *pjVar2;
  
  pjVar1 = jp2_box_create0();
  if (pjVar1 != (jp2_box_t *)0x0) {
    pjVar1->type = (long)type;
    pjVar1->len = 0;
    pjVar2 = jp2_boxinfolookup(type);
    pjVar1->info = pjVar2;
    pjVar1->ops = &pjVar2->ops;
  }
  return pjVar1;
}

Assistant:

jp2_box_t *jp2_box_create(int type)
{
	jp2_box_t *box;
	const jp2_boxinfo_t *boxinfo;
	if (!(box = jp2_box_create0())) {
		return 0;
	}
	box->type = type;
	box->len = 0;
	if (!(boxinfo = jp2_boxinfolookup(type))) {
		return 0;
	}
	box->info = boxinfo;
	box->ops = &boxinfo->ops;
	return box;
}